

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this)

{
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_RDI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  reader;
  TextReader<fmt::Locale> bound_reader;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  bound_handler;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff60;
  NLHeader *in_stack_ffffffffffffff68;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff70;
  TextReader<fmt::Locale> local_70;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_18;
  
  if (((ulong)in_RDI[1].builder_ & 1) == 0) {
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)bound_handler.super_NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
            .
            super_NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
            ._vptr_NLHandler,(TextReader<fmt::Locale> *)bound_reader.locale_.super_Locale.locale_);
  }
  else {
    VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::VarBoundHandler((VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       *)in_stack_ffffffffffffff60,in_RDI);
    TextReader<fmt::Locale>::TextReader
              (in_stack_ffffffffffffff70,(TextReader<fmt::Locale> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
    ::NLReader((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                *)&stack0xffffffffffffff60,&local_70,(NLHeader *)in_RDI->builder_,&local_18,
               *(int *)&in_RDI[1].builder_);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
    ::Read((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
            *)bound_reader._72_8_,(TextReader<fmt::Locale> *)bound_reader.line_start_);
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)bound_handler.super_NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
            .
            super_NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
            ._vptr_NLHandler,(TextReader<fmt::Locale> *)bound_reader.locale_.super_Locale.locale_);
    TextReader<fmt::Locale>::~TextReader(in_stack_ffffffffffffff60);
    VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    ::~VarBoundHandler((VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)0x6bc1ee);
  }
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndInput
            ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
             in_RDI[1]._vptr_NLProblemBuilder);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}